

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinger.c
# Opt level: O1

void pinger_timer(void *ctx,unsigned_long now)

{
  if ((*(char *)((long)ctx + 4) == '\x01') && (*(unsigned_long *)((long)ctx + 0x10) == now)) {
    (**(code **)(**(long **)((long)ctx + 0x18) + 0x30))(*(long **)((long)ctx + 0x18),3,0);
    *(undefined1 *)((long)ctx + 4) = 0;
    pinger_schedule((Pinger *)ctx);
    return;
  }
  return;
}

Assistant:

static void pinger_timer(void *ctx, unsigned long now)
{
    Pinger *pinger = (Pinger *)ctx;

    if (pinger->pending && now == pinger->next) {
        backend_special(pinger->backend, SS_PING, 0);
        pinger->pending = false;
        pinger_schedule(pinger);
    }
}